

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O3

void __thiscall
FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::FileInfoWrapper
          (FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *this,
          IFileReaderFactory *fileReaderFactory)

{
  UL *pUVar1;
  
  this->_vptr_FileInfoWrapper = (_func_int **)&PTR__FileInfoWrapper_00113b98;
  AS_02::JP2K::MXFReader::MXFReader(&this->m_Reader,fileReaderFactory);
  (this->m_Desc).super_PictureDescriptor.EditRate.Numerator = 0;
  (this->m_Desc).super_PictureDescriptor.EditRate.Denominator = 0;
  (this->m_Desc).super_PictureDescriptor.SampleRate.Numerator = 0;
  (this->m_Desc).super_PictureDescriptor.SampleRate.Denominator = 0;
  (this->m_Desc).super_PictureDescriptor.AspectRatio.Numerator = 0;
  (this->m_Desc).super_PictureDescriptor.AspectRatio.Denominator = 0;
  (this->m_Desc).m_RGBADescriptor = (RGBAEssenceDescriptor *)0x0;
  (this->m_Desc).m_CDCIDescriptor = (CDCIEssenceDescriptor *)0x0;
  (this->m_Desc).m_JP2KSubDescriptor = (JPEG2000PictureSubDescriptor *)0x0;
  ASDCP::WriterInfo::WriterInfo(&this->m_WriterInfo);
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_HasValue = false;
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[0] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[1] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[2] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[3] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[4] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[5] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar1 = &this->m_PictureEssenceCoding;
  (pUVar1->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[0xf] = '\0';
  this->m_MaxBitrate = 0.0;
  this->m_AvgBitrate = 0.0;
  (this->m_PictureEssenceCoding).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00113ae8;
  return;
}

Assistant:

FileInfoWrapper(const IFileReaderFactory& fileReaderFactory) : m_MaxBitrate(0.0), m_AvgBitrate(0.0), m_Reader(fileReaderFactory) {}